

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StorageReader.cpp
# Opt level: O0

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
MILBlob::Blob::StorageReader::Impl::GetAllOffsets
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,Impl *this)

{
  pointer this_00;
  undefined1 local_88 [8];
  blob_metadata metadata;
  ulong uStack_40;
  uint32_t i;
  uint64_t currMetadataOffset;
  undefined1 local_25;
  uint local_24;
  storage_header *psStack_20;
  uint32_t numBlobs;
  storage_header *header;
  Impl *this_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *allOffsets;
  
  header = (storage_header *)this;
  this_local = (Impl *)__return_storage_ptr__;
  EnsureLoaded(this);
  this_00 = std::
            unique_ptr<const_MILBlob::Blob::MMapFileReader,_std::default_delete<const_MILBlob::Blob::MMapFileReader>_>
            ::operator->(&this->m_reader);
  psStack_20 = MMapFileReader::ReadStruct<MILBlob::Blob::storage_header>(this_00,0);
  local_24 = psStack_20->count;
  local_25 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(__return_storage_ptr__);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (__return_storage_ptr__,(ulong)local_24);
  uStack_40 = 0x40;
  for (metadata.reserved_4._4_4_ = 0; metadata.reserved_4._4_4_ < local_24;
      metadata.reserved_4._4_4_ = metadata.reserved_4._4_4_ + 1) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (__return_storage_ptr__,&stack0xffffffffffffffc0);
    GetMetadata((blob_metadata *)local_88,this,uStack_40);
    uStack_40 = metadata.sizeInBytes + metadata._0_8_;
    if ((uStack_40 & 0x3f) != 0) {
      uStack_40 = (0x40 - (uStack_40 & 0x3f)) + uStack_40;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint64_t> GetAllOffsets() const
    {
        EnsureLoaded();

        const auto& header = m_reader->ReadStruct<storage_header>(0);
        auto numBlobs = header.count;

        std::vector<uint64_t> allOffsets;
        allOffsets.reserve(numBlobs);
        // The first metadata offset lies just after the file header.
        uint64_t currMetadataOffset = sizeof(storage_header);
        for (uint32_t i = 0; i < numBlobs; ++i) {
            allOffsets.push_back(currMetadataOffset);
            auto metadata = GetMetadata(currMetadataOffset);
            // Update offset for next iteration to aligned value.
            currMetadataOffset = metadata.offset + metadata.sizeInBytes;
            if (currMetadataOffset % DefaultStorageAlignment != 0) {
                currMetadataOffset += DefaultStorageAlignment - currMetadataOffset % DefaultStorageAlignment;
            }
        }
        return allOffsets;
    }